

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_Data_PDU::Decode
          (Minefield_Data_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT8 *V;
  byte bVar1;
  pointer puVar2;
  pointer pMVar3;
  KBOOL KVar4;
  KUINT8 KVar5;
  KUINT16 KVar6;
  ushort uVar7;
  KException *this_00;
  int iVar8;
  undefined7 in_register_00000011;
  byte *pbVar9;
  byte bVar10;
  char cVar11;
  long lVar12;
  KUINT8 j;
  ulong uVar13;
  bool bVar14;
  KUINT8 ui8Tmp;
  KUINT8 ui8Pad;
  KUINT8 *local_188;
  MinefieldDataFilter *local_180;
  vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_> *local_178;
  Minefield_Data_PDU *local_170;
  KUINT16 ui16SnsTyp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vNumVerts;
  KUINT16 ui16Pad;
  undefined2 uStack_13e;
  undefined4 uStack_13c;
  vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> vVerts;
  Vector local_48;
  
  KVar6 = KDataStream::GetBufferSize(stream);
  iVar8 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar8 = 0;
  }
  if (iVar8 + (uint)KVar6 < 0x2c) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ui16Pad,"Decode",(allocator<char> *)&vNumVerts);
    KException::KException(this_00,(KString *)&ui16Pad,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  puVar2 = (this->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  local_178 = &this->m_vMines;
  std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::clear(local_178);
  Minefield_Header::Decode(&this->super_Minefield_Header,stream,ignoreHeader);
  (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_ReqID,stream);
  KDataStream::Read<unsigned_short>(stream,&(this->m_SeqNumUnion).m_ui16SeqNum);
  KDataStream::Read(stream,&this->m_ui8ReqID);
  KDataStream::Read(stream,&this->m_ui8PduSeqNum);
  KDataStream::Read(stream,&this->m_ui8NumPdus);
  local_188 = &this->m_ui8NumMines;
  KDataStream::Read(stream,local_188);
  V = &this->m_ui8NumSensTyp;
  KDataStream::Read(stream,V);
  KDataStream::Read(stream,&this->m_ui8Padding1);
  local_180 = &this->m_DataFilter;
  (*(this->m_DataFilter).super_DataTypeBase._vptr_DataTypeBase[3])(local_180,stream);
  (*(this->m_MineTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MineTyp,stream);
  ui16SnsTyp = 0;
  for (bVar10 = 0; bVar10 < *V; bVar10 = bVar10 + 1) {
    KDataStream::Read<unsigned_short>(stream,&ui16SnsTyp);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16SensorTypes,&ui16SnsTyp);
  }
  if ((*V & 1) != 0) {
    ui16Pad._0_1_ = '\0';
    ui16Pad._1_1_ = 0;
    KDataStream::Read<unsigned_short>(stream,&ui16Pad);
  }
  for (bVar10 = 0; bVar10 < *local_188; bVar10 = bVar10 + 1) {
    DATA_TYPE::Mine::Mine((Mine *)&ui16Pad);
    DATA_TYPE::Vector::Vector((Vector *)&vNumVerts,stream);
    DATA_TYPE::Mine::SetLocation((Mine *)&ui16Pad,(Vector *)&vNumVerts);
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&vNumVerts);
    std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::push_back
              (local_178,(Mine *)&ui16Pad);
    DATA_TYPE::Mine::~Mine((Mine *)&ui16Pad);
  }
  local_170 = this;
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsGroundBurialDepthOffset(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      KDataStream::Read<float>(stream,(float *)&ui16Pad);
      DATA_TYPE::Mine::SetGroundBurialDepthOffsetValue
                ((Mine *)((long)&(((local_178->
                                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase +
                         lVar12),
                 (KFLOAT32)CONCAT22(uStack_13e,CONCAT11(ui16Pad._1_1_,(KUINT8)ui16Pad)));
      lVar12 = lVar12 + 0xe0;
    }
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsWaterBurialDepthOffset(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      KDataStream::Read<float>(stream,(float *)&ui16Pad);
      DATA_TYPE::Mine::SetWaterBurialDepthOffsetValue
                ((Mine *)((long)&(((local_178->
                                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase +
                         lVar12),
                 (KFLOAT32)CONCAT22(uStack_13e,CONCAT11(ui16Pad._1_1_,(KUINT8)ui16Pad)));
      lVar12 = lVar12 + 0xe0;
    }
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsSnowBurialDepthOffset(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      KDataStream::Read<float>(stream,(float *)&ui16Pad);
      DATA_TYPE::Mine::SetSnowBurialDepthOffsetValue
                ((Mine *)((long)&(((local_178->
                                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase +
                         lVar12),
                 (KFLOAT32)CONCAT22(uStack_13e,CONCAT11(ui16Pad._1_1_,(KUINT8)ui16Pad)));
      lVar12 = lVar12 + 0xe0;
    }
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsMineOrientation(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      pMVar3 = (local_178->
               super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
               _M_impl.super__Vector_impl_data._M_start;
      DATA_TYPE::EulerAngles::EulerAngles((EulerAngles *)&ui16Pad,stream);
      DATA_TYPE::Mine::SetMineOrientationValue
                ((Mine *)((long)&(pMVar3->super_MinefieldDataFilter).super_DataTypeBase.
                                 _vptr_DataTypeBase + lVar12),(EulerAngles *)&ui16Pad);
      DATA_TYPE::EulerAngles::~EulerAngles((EulerAngles *)&ui16Pad);
      lVar12 = lVar12 + 0xe0;
    }
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsThermalContrast(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      KDataStream::Read<float>(stream,(float *)&ui16Pad);
      DATA_TYPE::Mine::SetThermalContrastValue
                ((Mine *)((long)&(((local_178->
                                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase +
                         lVar12),
                 (KFLOAT32)CONCAT22(uStack_13e,CONCAT11(ui16Pad._1_1_,(KUINT8)ui16Pad)));
      lVar12 = lVar12 + 0xe0;
    }
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsReflectance(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      KDataStream::Read<float>(stream,(float *)&ui16Pad);
      DATA_TYPE::Mine::SetReflectanceValue
                ((Mine *)((long)&(((local_178->
                                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase +
                         lVar12),
                 (KFLOAT32)CONCAT22(uStack_13e,CONCAT11(ui16Pad._1_1_,(KUINT8)ui16Pad)));
      lVar12 = lVar12 + 0xe0;
    }
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsMineEmplacementAge(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      pMVar3 = (local_178->
               super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
               _M_impl.super__Vector_impl_data._M_start;
      DATA_TYPE::ClockTime::ClockTime((ClockTime *)&ui16Pad,stream);
      DATA_TYPE::Mine::SetMineEmplacementAgeValue
                ((Mine *)((long)&(pMVar3->super_MinefieldDataFilter).super_DataTypeBase.
                                 _vptr_DataTypeBase + lVar12),(ClockTime *)&ui16Pad);
      DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&ui16Pad);
      lVar12 = lVar12 + 0xe0;
    }
  }
  lVar12 = 0;
  for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
    KDataStream::Read<unsigned_short>(stream,&ui16Pad);
    DATA_TYPE::Mine::SetID
              ((Mine *)((long)&(((local_178->
                                 super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase +
                       lVar12),CONCAT11(ui16Pad._1_1_,(KUINT8)ui16Pad));
    lVar12 = lVar12 + 0xe0;
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsFusing(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      pMVar3 = (local_178->
               super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
               _M_impl.super__Vector_impl_data._M_start;
      DATA_TYPE::MineFusing::MineFusing((MineFusing *)&ui16Pad,stream);
      DATA_TYPE::Mine::SetFusingValue
                ((Mine *)((long)&(pMVar3->super_MinefieldDataFilter).super_DataTypeBase.
                                 _vptr_DataTypeBase + lVar12),(MineFusing *)&ui16Pad);
      DATA_TYPE::MineFusing::~MineFusing((MineFusing *)&ui16Pad);
      lVar12 = lVar12 + 0xe0;
    }
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsScalarDetectionCoefficient(local_180);
  if (KVar4) {
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      for (bVar10 = 0; bVar10 < *V; bVar10 = bVar10 + 1) {
        ui16Pad._0_1_ = '\0';
        KDataStream::Read(stream,(KUOCTET *)&ui16Pad);
        DATA_TYPE::Mine::AddScalarDetectionCoefficientValue
                  ((local_178->
                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar13,(KUINT8)ui16Pad);
      }
    }
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsPaintScheme(local_180);
  if (KVar4) {
    lVar12 = 0;
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      pMVar3 = (local_178->
               super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
               _M_impl.super__Vector_impl_data._M_start;
      DATA_TYPE::MinePaintScheme::MinePaintScheme((MinePaintScheme *)&ui16Pad,stream);
      DATA_TYPE::Mine::SetPaintSchemeValue
                ((Mine *)((long)&(pMVar3->super_MinefieldDataFilter).super_DataTypeBase.
                                 _vptr_DataTypeBase + lVar12),(MinePaintScheme *)&ui16Pad);
      DATA_TYPE::MinePaintScheme::~MinePaintScheme((MinePaintScheme *)&ui16Pad);
      lVar12 = lVar12 + 0xe0;
    }
  }
  KVar5 = calcPaddingPaintScheme(local_170);
  ui8Pad = '\0';
  while (bVar14 = KVar5 != '\0', KVar5 = KVar5 + 0xff, bVar14) {
    KDataStream::Read(stream,&ui8Pad);
  }
  KVar4 = DATA_TYPE::MinefieldDataFilter::IsTripDetonationWire(local_180);
  if (KVar4) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ui16Pad,(ulong)*local_188,
               (allocator_type *)&vNumVerts);
    ui8Tmp = '\0';
    uVar7 = 0;
    for (bVar10 = 0; bVar1 = *local_188, bVar10 < bVar1; bVar10 = bVar10 + 1) {
      KDataStream::Read(stream,&ui8Tmp);
      KVar5 = ui8Tmp;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ui16Pad,&ui8Tmp);
      uVar7 = KVar5 + uVar7;
    }
    for (bVar10 = 0; bVar10 < (byte)((int)(short)(4 - (ushort)bVar1) % 4); bVar10 = bVar10 + 1) {
      KDataStream::Read(stream,&ui8Pad);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&vNumVerts,(ulong)uVar7,(allocator_type *)&vVerts);
    for (bVar10 = 0; bVar10 < uVar7; bVar10 = bVar10 + 1) {
      KDataStream::Read(stream,&ui8Tmp);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&vNumVerts,&ui8Tmp);
    }
    uVar13 = (long)vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    pbVar9 = vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((uVar13 & 3) != 0) {
      for (bVar10 = 0;
          pbVar9 = vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start, bVar10 < (byte)(4 - ((byte)uVar13 & 3))
          ; bVar10 = bVar10 + 1) {
        KDataStream::Read(stream,&ui8Pad);
      }
    }
    for (uVar13 = 0; uVar13 < *local_188; uVar13 = uVar13 + 1) {
      local_180 = (MinefieldDataFilter *)
                  CONCAT71(local_180._1_7_,
                           *(undefined1 *)
                            (CONCAT44(uStack_13c,
                                      CONCAT22(uStack_13e,CONCAT11(ui16Pad._1_1_,(KUINT8)ui16Pad)))
                            + uVar13));
      local_170 = (Minefield_Data_PDU *)(uVar13 * 0xe0);
      for (cVar11 = '\0'; cVar11 != (char)local_180; cVar11 = cVar11 + '\x01') {
        std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::vector
                  (&vVerts,(ulong)*pbVar9,(allocator_type *)&local_48);
        bVar10 = *pbVar9;
        while (bVar14 = bVar10 != 0, bVar10 = bVar10 - 1, bVar14) {
          DATA_TYPE::Vector::Vector(&local_48,stream);
          std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::
          emplace_back<KDIS::DATA_TYPE::Vector>(&vVerts,&local_48);
          DATA_TYPE::DataTypeBase::~DataTypeBase(&local_48.super_DataTypeBase);
        }
        DATA_TYPE::Mine::AddTripDetonationWire
                  ((Mine *)((long)&(local_170->super_Minefield_Header).super_Header.super_Header6.
                                   _vptr_Header6 +
                           (long)(local_178->
                                 super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                 )._M_impl.super__Vector_impl_data._M_start),&vVerts);
        pbVar9 = pbVar9 + 1;
        std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::~vector
                  (&vVerts);
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ui16Pad);
  }
  return;
}

Assistant:

void Minefield_Data_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_DATA_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui16SensorTypes.clear();
    m_vMines.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_SeqNumUnion.m_ui16SeqNum
           >> m_ui8ReqID
           >> m_ui8PduSeqNum
           >> m_ui8NumPdus
           >> m_ui8NumMines
           >> m_ui8NumSensTyp
           >> m_ui8Padding1
           >> KDIS_STREAM m_DataFilter
           >> KDIS_STREAM m_MineTyp;

    // Sensor Types
    KUINT16 ui16SnsTyp = 0;
    KUINT8 i = 0;
    for( i = 0; i < m_ui8NumSensTyp; ++i )
    {
        stream >> ui16SnsTyp;
        m_vui16SensorTypes.push_back( ui16SnsTyp );
    }

    // Padding?
    KUINT8 ui8PaddingNeeded1 = m_ui8NumSensTyp % 2;
    if( ui8PaddingNeeded1 )
    {
        KUINT16 ui16Pad = 0;
        stream >> ui16Pad;
    }

    /************************************************************************/
    /* Mines                                                                */
    /************************************************************************/

    // Create the mines and extract location from stream
    for( i = 0; i < m_ui8NumMines; ++i )
    {
        Mine mn;
        mn.SetLocation( Vector( stream ) );
        m_vMines.push_back( mn );
    }

    // The following are all dependent on the data filter( except ID ):
    if( m_DataFilter.IsGroundBurialDepthOffset() )  MINE_DECODE_NATIVE( KFLOAT32, SetGroundBurialDepthOffsetValue )
        if( m_DataFilter.IsWaterBurialDepthOffset() )   MINE_DECODE_NATIVE( KFLOAT32, SetWaterBurialDepthOffsetValue )
            if( m_DataFilter.IsSnowBurialDepthOffset() )    MINE_DECODE_NATIVE( KFLOAT32, SetSnowBurialDepthOffsetValue )
                if( m_DataFilter.IsMineOrientation() )          MINE_DECODE_CLASS( EulerAngles, SetMineOrientationValue )
                    if( m_DataFilter.IsThermalContrast() )          MINE_DECODE_NATIVE( KFLOAT32, SetThermalContrastValue )
                        if( m_DataFilter.IsReflectance() )              MINE_DECODE_NATIVE( KFLOAT32, SetReflectanceValue )
                            if( m_DataFilter.IsMineEmplacementAge() )       MINE_DECODE_CLASS( ClockTime, SetMineEmplacementAgeValue )
                                MINE_DECODE_NATIVE( KUINT16, SetID )
                                if( m_DataFilter.IsFusing() )                   MINE_DECODE_CLASS( MineFusing, SetFusingValue )

                                    if( m_DataFilter.IsScalarDetectionCoefficient() )
                                    {
                                        for( i = 0; i < m_ui8NumMines; ++i )
                                        {
                                            for( KUINT8 j = 0; j < m_ui8NumSensTyp; ++j )
                                            {
                                                KUINT8 ui8Sdc = 0;
                                                stream >> ui8Sdc;
                                                m_vMines[i].AddScalarDetectionCoefficientValue( ui8Sdc );
                                            }
                                        }
                                    }

    if( m_DataFilter.IsPaintScheme() ) MINE_DECODE_CLASS( MinePaintScheme, SetPaintSchemeValue )

    // Do we need to add padding?
    // Padding � 8{[4 � N(2 F(8) + M F(9) + F(10) + 2)] mod4} bits unused
    KUINT8 ui8PaddingNeeded2 = calcPaddingPaintScheme();
    KUINT8 ui8Pad = 0;
    for( KUINT8 i = 0; i < ui8PaddingNeeded2; ++i )
    {
        stream >> ui8Pad;
    }

    // Trip/Det wires
    if( m_DataFilter.IsTripDetonationWire() )
    {
        // Get the number of trip/det wires
        vector<KUINT8> vNumTripDet( m_ui8NumMines );
        KUINT16 ui16TtlVerts = 0;
        KUINT8 ui8Tmp = 0;
        for( i = 0; i < m_ui8NumMines; ++i )
        {
            stream >> ui8Tmp;
            ui16TtlVerts += ui8Tmp;
            vNumTripDet.push_back( ui8Tmp );
        }

        // Do we need to extract any padding?
        KUINT8 ui8PaddingNeeded = ( 4 - m_ui8NumMines ) % 4;
        for( i = 0; i < ui8PaddingNeeded; ++i )
        {
            stream >> ui8Pad;
        }

        // Number of vertices's.
        vector<KUINT8> vNumVerts( ui16TtlVerts );
        for( i = 0; i < ui16TtlVerts; ++i )
        {
            stream >> ui8Tmp;
            vNumVerts.push_back( ui8Tmp );
        }

        // More padding?
        ui8PaddingNeeded = ( vNumVerts.size() % 4 == 0 ? 0 : ( 4 - vNumVerts.size() % 4 ) );
        for( i = 0; i < ui8PaddingNeeded; ++i )
        {
            stream >> ui8Pad;
        }

        // Extract all vertices's and place them into the correct mines.
        // For each mine
        vector<KUINT8>::const_iterator citrVert = vNumVerts.begin();
        for( i = 0; i < m_ui8NumMines; ++i )
        {
            // For each wire in the mine
            KUINT8 ui8Loop = vNumTripDet[i];
            for( KUINT8 j = 0; j < ui8Loop; ++j )
            {
                // Get the vertices's.
                vector<Vector> vVerts( *citrVert );
                KUINT8 ui8LoopVerts = *citrVert;
                for( KUINT8 k = 0; k < ui8LoopVerts; ++k )
                {
                    vVerts.push_back( Vector( stream ) );
                }

                // Add the vertices's to the current mine.
                m_vMines[i].AddTripDetonationWire( vVerts );
                ++citrVert;
            }
        }
    }
}